

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_warp_piecewise_linear.c
# Opt level: O2

void fe_warp_piecewise_linear_set_parameters(char *param_str,float sampling_rate)

{
  int iVar1;
  char *str;
  bool bVar2;
  long lVar3;
  double dVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  char temp_param_str [256];
  
  nyquist_frequency = sampling_rate * 0.5;
  if (param_str == (char *)0x0) {
    is_neutral = 0;
  }
  else {
    iVar1 = strcmp(param_str,p_str);
    if (iVar1 != 0) {
      is_neutral = 1;
      strcpy(temp_param_str,param_str);
      params[0] = 0.0;
      params[1] = 0.0;
      final_piece[0] = 0.0;
      final_piece[1] = 0.0;
      strcpy(p_str,param_str);
      str = strtok(temp_param_str," \t");
      if (str != (char *)0x0) {
        bVar2 = true;
        lVar3 = 0;
        do {
          dVar4 = atof_c(str);
          params[lVar3] = (float)dVar4;
          str = strtok((char *)0x0," \t");
          if (!bVar2) break;
          bVar2 = false;
          lVar3 = 1;
        } while (str != (char *)0x0);
        if (str != (char *)0x0) {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_warp_piecewise_linear.c"
                  ,0x8e,"Piecewise linear warping takes up to two arguments, %s ignored.\n",str);
        }
      }
      if (sampling_rate <= params[1]) {
        final_piece[0] = 0.0;
        final_piece[1] = 0.0;
      }
      else {
        fVar5 = params[1];
        if ((params[1] == 0.0) && (!NAN(params[1]))) {
          fVar5 = sampling_rate * 0.85;
          params[1] = fVar5;
        }
        auVar6._0_4_ = nyquist_frequency - params[0] * fVar5;
        auVar6._4_4_ = (params[0] + -1.0) * nyquist_frequency * fVar5;
        auVar6._8_8_ = 0;
        auVar7._4_4_ = nyquist_frequency - fVar5;
        auVar7._0_4_ = nyquist_frequency - fVar5;
        auVar7._8_8_ = 0;
        auVar7 = divps(auVar6,auVar7);
        final_piece = auVar7._0_8_;
      }
      if ((params[0] == 0.0) && (!NAN(params[0]))) {
        is_neutral = 0;
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_warp_piecewise_linear.c"
                ,0xa7,"Piecewise linear warping cannot have slope zero, warping not applied.\n");
      }
    }
  }
  return;
}

Assistant:

void
fe_warp_piecewise_linear_set_parameters(char const *param_str,
                                        float sampling_rate)
{
    char *tok;
    char *seps = " \t";
    char temp_param_str[256];
    int param_index = 0;

    nyquist_frequency = sampling_rate / 2;
    if (param_str == NULL) {
        is_neutral = YES;
        return;
    }
    /* The new parameters are the same as the current ones, so do nothing. */
    if (strcmp(param_str, p_str) == 0) {
        return;
    }
    is_neutral = NO;
    strcpy(temp_param_str, param_str);
    memset(params, 0, N_PARAM * sizeof(float));
    memset(final_piece, 0, 2 * sizeof(float));
    strcpy(p_str, param_str);
    /* FIXME: strtok() is not re-entrant... */
    tok = strtok(temp_param_str, seps);
    while (tok != NULL) {
        params[param_index++] = (float) atof_c(tok);
        tok = strtok(NULL, seps);
        if (param_index >= N_PARAM) {
            break;
        }
    }
    if (tok != NULL) {
        E_INFO
            ("Piecewise linear warping takes up to two arguments, %s ignored.\n",
             tok);
    }
    if (params[1] < sampling_rate) {
        /* Precompute these. These are the coefficients of a
         * straight line that contains the points (F, aF) and (N,
         * N), where a = params[0], F = params[1], N = Nyquist
         * frequency.
         */
        if (params[1] == 0) {
            params[1] = sampling_rate * 0.85f;
        }
        final_piece[0] =
            (nyquist_frequency -
             params[0] * params[1]) / (nyquist_frequency - params[1]);
        final_piece[1] =
            nyquist_frequency * params[1] * (params[0] -
                                         1.0f) / (nyquist_frequency -
                                                  params[1]);
    }
    else {
        memset(final_piece, 0, 2 * sizeof(float));
    }
    if (params[0] == 0) {
        is_neutral = YES;
        E_INFO
            ("Piecewise linear warping cannot have slope zero, warping not applied.\n");
    }
}